

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructuresOperators.cpp
# Opt level: O3

ostream * operator<<(ostream *outs,Point *point)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(outs,"{",1);
  poVar1 = std::ostream::_M_insert<double>((double)point->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)point->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)point->z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  return outs;
}

Assistant:

std::ostream& operator<<(std::ostream& outs, Point const& point)
{
  outs << "{" << point.x << " " << point.y << " " << point.z << "}";
  return outs;
}